

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O2

int64_t __thiscall brown::MySimulator::linearSpeedCurve(MySimulator *this,int64_t tt)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  
  if (linearSpeedCurve(long)::r2 == '\0') {
    iVar2 = __cxa_guard_acquire(&linearSpeedCurve(long)::r2);
    if (iVar2 != 0) {
      lVar1 = (this->super_Simulator).CLKFRQ;
      linearSpeedCurve::r2 = lVar1 * lVar1;
      __cxa_guard_release(&linearSpeedCurve(long)::r2);
    }
  }
  if (linearSpeedCurve(long)::rv0 == '\0') {
    iVar2 = __cxa_guard_acquire(&linearSpeedCurve(long)::rv0);
    if (iVar2 != 0) {
      linearSpeedCurve::rv0 = (long)(this->super_Simulator).MINVEL * (this->super_Simulator).CLKFRQ;
      __cxa_guard_release(&linearSpeedCurve(long)::rv0);
    }
  }
  if (linearSpeedCurve(long)::a == '\0') {
    iVar2 = __cxa_guard_acquire(&linearSpeedCurve(long)::a);
    if (iVar2 != 0) {
      linearSpeedCurve::a = (int64_t)(((this->super_Simulator).MAXACC << 2) / 5);
      __cxa_guard_release(&linearSpeedCurve(long)::a);
    }
  }
  if (linearSpeedCurve(long)::lt == '\0') {
    iVar2 = __cxa_guard_acquire(&linearSpeedCurve(long)::lt);
    if (iVar2 != 0) {
      linearSpeedCurve::lt = (long)(this->super_Simulator).MAXT * 2;
      __cxa_guard_release(&linearSpeedCurve(long)::lt);
    }
  }
  if (tt < linearSpeedCurve::lt) {
    iVar3 = (int64_t)(this->super_Simulator).MAXT;
  }
  else {
    iVar3 = linearSpeedCurve::r2 /
            ((tt - linearSpeedCurve::lt) * linearSpeedCurve::a + linearSpeedCurve::rv0);
  }
  return iVar3;
}

Assistant:

std::int64_t MySimulator::linearSpeedCurve(std::int64_t tt) {
    static std::int64_t r2 = CLKFRQ * CLKFRQ;
    static std::int64_t rv0 = CLKFRQ * MINVEL;
    static std::int64_t a = MAXACC*4/5;
    static std::int64_t lt = MAXT*2; // low speed period

    std::int64_t vt = 0;
    if (tt < lt) {
        vt = MAXT;
    } else {
        vt = r2/(rv0 + a*(tt-lt));
    }
    return vt;
}